

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

socket_t __thiscall httplib::ClientImpl::create_client_socket(ClientImpl *this,Error *error)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  function<void_(int)> local_70;
  function<void_(int)> local_40;
  Error *local_20;
  Error *error_local;
  ClientImpl *this_local;
  
  local_20 = error;
  error_local = (Error *)this;
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) && (this->proxy_port_ != -1)) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar2 = this->proxy_port_;
    bVar1 = this->tcp_nodelay_;
    std::function<void_(int)>::function(&local_40,&this->socket_options_);
    this_local._4_4_ =
         detail::create_client_socket
                   (pcVar4,iVar2,(bool)(bVar1 & 1),&local_40,this->connection_timeout_sec_,
                    this->connection_timeout_usec_,&this->interface_,local_20);
    std::function<void_(int)>::~function(&local_40);
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar2 = this->port_;
    bVar1 = this->tcp_nodelay_;
    std::function<void_(int)>::function(&local_70,&this->socket_options_);
    this_local._4_4_ =
         detail::create_client_socket
                   (pcVar4,iVar2,(bool)(bVar1 & 1),&local_70,this->connection_timeout_sec_,
                    this->connection_timeout_usec_,&this->interface_,local_20);
    std::function<void_(int)>::~function(&local_70);
  }
  return this_local._4_4_;
}

Assistant:

inline socket_t ClientImpl::create_client_socket(Error &error) const {
		if (!proxy_host_.empty() && proxy_port_ != -1) {
			return detail::create_client_socket(
					proxy_host_.c_str(), proxy_port_, tcp_nodelay_, socket_options_,
					connection_timeout_sec_, connection_timeout_usec_, interface_, error);
		}
		return detail::create_client_socket(
				host_.c_str(), port_, tcp_nodelay_, socket_options_,
				connection_timeout_sec_, connection_timeout_usec_, interface_, error);
	}